

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

file_status __thiscall
ghc::filesystem::detail::symlink_status_ex
          (detail *this,path *p,error_code *ec,uintmax_t *sz,uintmax_t *nhl,time_t *lwt)

{
  bool bVar1;
  int iVar2;
  value_type *__file;
  error_code eVar3;
  undefined4 uStack_dc;
  undefined1 local_c8 [4];
  int result;
  stat fs;
  time_t *lwt_local;
  uintmax_t *nhl_local;
  uintmax_t *sz_local;
  error_code *ec_local;
  path *p_local;
  file_status *f_s;
  
  fs.__glibc_reserved[2] = (__syscall_slong_t)lwt;
  __file = path::c_str(p);
  iVar2 = lstat(__file,(stat *)local_c8);
  if (iVar2 == 0) {
    std::error_code::clear(ec);
    file_status_from_st_mode<unsigned_int>(this,(uint)fs.st_nlink);
  }
  else {
    eVar3 = make_system_error(0);
    *(ulong *)ec = CONCAT44(uStack_dc,eVar3._M_value);
    ec->_M_cat = eVar3._M_cat;
    bVar1 = is_not_found_error(ec);
    if (bVar1) {
      file_status::file_status((file_status *)this,not_found,unknown);
    }
    else {
      file_status::file_status((file_status *)this,none,unknown);
    }
  }
  return (file_status)this;
}

Assistant:

GHC_INLINE file_status symlink_status_ex(const path& p, std::error_code& ec, uintmax_t* sz = nullptr, uintmax_t* nhl = nullptr, time_t* lwt = nullptr) noexcept
{
#ifdef GHC_OS_WINDOWS
    file_status fs;
    WIN32_FILE_ATTRIBUTE_DATA attr;
    if (!GetFileAttributesExW(GHC_NATIVEWP(p), GetFileExInfoStandard, &attr)) {
        ec = detail::make_system_error();
    }
    else {
        ec.clear();
        fs = detail::status_from_INFO(p, &attr, ec, sz, lwt);
        if (nhl) {
            *nhl = 0;
        }
        if (attr.dwFileAttributes & FILE_ATTRIBUTE_REPARSE_POINT) {
            fs.type(file_type::symlink);
        }
    }
    if (detail::is_not_found_error(ec)) {
        return file_status(file_type::not_found);
    }
    return ec ? file_status(file_type::none) : fs;
#else
    (void)sz;
    (void)nhl;
    (void)lwt;
    struct ::stat fs;
    auto result = ::lstat(p.c_str(), &fs);
    if (result == 0) {
        ec.clear();
        file_status f_s = detail::file_status_from_st_mode(fs.st_mode);
        return f_s;
    }
    ec = detail::make_system_error();
    if (detail::is_not_found_error(ec)) {
        return file_status(file_type::not_found, perms::unknown);
    }
    return file_status(file_type::none);
#endif
}